

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O0

bool __thiscall ObjectList::hit(ObjectList *this,Ray *r,double t_min,double t_max,Hit *rec)

{
  bool bVar1;
  uint uVar2;
  __shared_ptr_access<Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar3;
  shared_ptr<Object> *object;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_> *__range1;
  double t_curr;
  undefined1 local_80 [7];
  bool hit_something;
  Hit temp_hit;
  Hit *rec_local;
  double t_max_local;
  double t_min_local;
  Ray *r_local;
  ObjectList *this_local;
  
  temp_hit.t_ = (double)rec;
  Hit::Hit((Hit *)local_80);
  t_curr._7_1_ = false;
  __end1 = std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::begin
                     (&this->objects_);
  object = (shared_ptr<Object> *)
           std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::end
                     (&this->objects_);
  __range1 = (vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_> *)t_max;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::shared_ptr<Object>_*,_std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>_>
                                     *)&object), bVar1) {
    this_00 = (__shared_ptr_access<Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<const_std::shared_ptr<Object>_*,_std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>_>
              ::operator*(&__end1);
    peVar3 = std::__shared_ptr_access<Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (this_00);
    uVar2 = (**peVar3->_vptr_Object)(t_min,__range1,peVar3,r,local_80);
    if (((uVar2 & 1) != 0) &&
       ((double)temp_hit.material_.super___shared_ptr<Material,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi < (double)__range1)) {
      t_curr._7_1_ = true;
      __range1 = (vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_> *)
                 temp_hit.material_.super___shared_ptr<Material,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      Hit::operator=((Hit *)temp_hit.t_,(Hit *)local_80);
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Object>_*,_std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>_>
    ::operator++(&__end1);
  }
  Hit::~Hit((Hit *)local_80);
  return t_curr._7_1_;
}

Assistant:

bool ObjectList::hit(const Ray& r, double t_min, double t_max, Hit& rec) const {
  Hit temp_hit;
  bool hit_something = false;
  double t_curr = t_max;

  for (const auto& object : objects_) {
    if (object->hit(r, t_min, t_curr, temp_hit) && temp_hit.t_ < t_curr) {
      hit_something = true;
      t_curr = temp_hit.t_;
      rec = temp_hit;
    }
  }
  return hit_something;
}